

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfsfileengine_unix.cpp
# Opt level: O0

int __thiscall QFSFileEngine::link(QFSFileEngine *this,char *__from,char *__to)

{
  byte bVar1;
  byte bVar2;
  QFSFileEnginePrivate *source;
  long in_FS_OFFSET;
  bool ret;
  QFSFileEnginePrivate *d;
  QSystemError error;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6f;
  QSystemError *error_00;
  FileError error_01;
  undefined6 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff86;
  undefined1 in_stack_ffffffffffffff87;
  QSystemError local_48 [8];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  source = d_func((QFSFileEngine *)0x2155f5);
  local_48[0] = (QSystemError)&DAT_aaaaaaaaaaaaaaaa;
  QSystemError::QSystemError(local_48);
  error_00 = (QSystemError *)&source->fileEntry;
  QFileSystemEntry::QFileSystemEntry
            ((QFileSystemEntry *)this,
             (QString *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
  bVar1 = QFileSystemEngine::createLink
                    ((QFileSystemEntry *)source,
                     (QFileSystemEntry *)
                     CONCAT17(in_stack_ffffffffffffff87,
                              CONCAT16(in_stack_ffffffffffffff86,in_stack_ffffffffffffff80)),
                     error_00);
  error_01 = (FileError)((ulong)error_00 >> 0x20);
  QFileSystemEntry::~QFileSystemEntry((QFileSystemEntry *)this);
  bVar2 = bVar1 & 1;
  if (bVar2 == 0) {
    QSystemError::toString
              ((QSystemError *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
    QAbstractFileEngine::setError
              ((QAbstractFileEngine *)CONCAT17(bVar2,CONCAT16(bVar1,in_stack_ffffffffffffff80)),
               error_01,(QString *)this);
    QString::~QString((QString *)0x21568d);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (uint)CONCAT71((int7)((ulong)*(long *)(in_FS_OFFSET + 0x28) >> 8),bVar2) & 0xffffff01;
  }
  __stack_chk_fail();
}

Assistant:

bool QFSFileEngine::link(const QString &newName)
{
    Q_D(QFSFileEngine);
    QSystemError error;
    bool ret = QFileSystemEngine::createLink(d->fileEntry, QFileSystemEntry(newName), error);
    if (!ret) {
        setError(QFile::RenameError, error.toString());
    }
    return ret;
}